

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool imageExists(string *rootDir,string *imageId)

{
  bool bVar1;
  anon_class_32_1_f54ffab6_for__M_pred local_60;
  __normal_iterator<const_Image_*,_std::vector<Image,_std::allocator<Image>_>_> local_40;
  __normal_iterator<const_Image_*,_std::vector<Image,_std::allocator<Image>_>_> local_38;
  undefined1 local_30 [8];
  vector<Image,_std::allocator<Image>_> images;
  string *imageId_local;
  string *rootDir_local;
  
  images.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)imageId;
  getContainerImages((vector<Image,_std::allocator<Image>_> *)local_30,rootDir);
  local_38._M_current =
       (Image *)std::vector<Image,_std::allocator<Image>_>::cbegin
                          ((vector<Image,_std::allocator<Image>_> *)local_30);
  local_40._M_current =
       (Image *)std::vector<Image,_std::allocator<Image>_>::cend
                          ((vector<Image,_std::allocator<Image>_> *)local_30);
  std::__cxx11::string::string
            ((string *)&local_60,
             (string *)
             images.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  bVar1 = std::
          any_of<__gnu_cxx::__normal_iterator<Image_const*,std::vector<Image,std::allocator<Image>>>,imageExists(std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
                    (local_38,local_40,&local_60);
  imageExists(std::__cxx11::string_const&,std::__cxx11::string_const&)::$_0::~__0((__0 *)&local_60);
  std::vector<Image,_std::allocator<Image>_>::~vector
            ((vector<Image,_std::allocator<Image>_> *)local_30);
  return bVar1;
}

Assistant:

bool imageExists(const std::string& rootDir, const std::string& imageId)
{
    auto images = getContainerImages(rootDir);
    return std::any_of(images.cbegin(), images.cend(),
                       [imageId](const Image& image) { return image.id == imageId; });
}